

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::scale(btSoftBody *this,btVector3 *scl)

{
  uint uVar1;
  Node *pNVar2;
  ulong uVar3;
  btVector3 *this_00;
  ulong uVar4;
  btScalar r;
  btDbvtVolume vol;
  btDbvtVolume local_78;
  btDbvtAabbMm local_50;
  
  (*((this->super_btCollisionObject).m_collisionShape)->_vptr_btCollisionShape[0xc])();
  uVar1 = (this->m_nodes).m_size;
  uVar4 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 * 0x78 - uVar4 != 0; uVar4 = uVar4 + 0x78) {
    pNVar2 = (this->m_nodes).m_data;
    this_00 = (btVector3 *)((long)(pNVar2->m_x).m_floats + uVar4);
    btVector3::operator*=(this_00,scl);
    btVector3::operator*=((btVector3 *)((long)(pNVar2->m_q).m_floats + uVar4),scl);
    btDbvtAabbMm::FromCR(&local_50,this_00,r);
    local_78.mx.m_floats[0] = local_50.mx.m_floats[0];
    local_78.mx.m_floats[1] = local_50.mx.m_floats[1];
    local_78.mx.m_floats[2] = local_50.mx.m_floats[2];
    local_78.mx.m_floats[3] = local_50.mx.m_floats[3];
    local_78.mi.m_floats[0] = local_50.mi.m_floats[0];
    local_78.mi.m_floats[1] = local_50.mi.m_floats[1];
    local_78.mi.m_floats[2] = local_50.mi.m_floats[2];
    local_78.mi.m_floats[3] = local_50.mi.m_floats[3];
    btDbvt::update(&this->m_ndbvt,*(btDbvtNode **)((long)(&pNVar2->m_n + 1) + uVar4 + 8),&local_78);
  }
  updateNormals(this);
  updateBounds(this);
  updateConstants(this);
  return;
}

Assistant:

void			btSoftBody::scale(const btVector3& scl)
{

	const btScalar	margin=getCollisionShape()->getMargin();
	ATTRIBUTE_ALIGNED16(btDbvtVolume)	vol;
	
	for(int i=0,ni=m_nodes.size();i<ni;++i)
	{
		Node&	n=m_nodes[i];
		n.m_x*=scl;
		n.m_q*=scl;
		vol = btDbvtVolume::FromCR(n.m_x,margin);
		m_ndbvt.update(n.m_leaf,vol);
	}
	updateNormals();
	updateBounds();
	updateConstants();
}